

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,Formals *formals)

{
  FrameTranslator *this_00;
  pointer ppVar1;
  pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *formal;
  pointer ppVar2;
  allocator<char> local_41;
  string local_40;
  
  this_00 = this->current_frame_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"this",&local_41);
  IRT::FrameTranslator::AddArgumentAddress(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ppVar1 = (formals->formals_).
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (formals->formals_).
                super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    IRT::FrameTranslator::AddArgumentAddress(this->current_frame_,&ppVar2->second);
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(Formals* formals) {
  current_frame_->AddArgumentAddress("this");
  for (const auto& formal : formals->formals_) {
    current_frame_->AddArgumentAddress(formal.second);
  }
}